

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

bool __thiscall
adios2sys::RegularExpression::find
          (RegularExpression *this,char *string,RegularExpressionMatch *rmatch)

{
  char **end;
  char cVar1;
  char *__s2;
  size_t __n;
  int iVar2;
  char *__s1;
  char *pcVar3;
  RegExpFind regFind;
  RegExpFind local_50;
  
  iVar2 = 0;
  rmatch->startp[0] = (char *)0x0;
  rmatch->endp[0] = (char *)0x0;
  rmatch->searchstring = string;
  pcVar3 = this->program;
  if (pcVar3 == (char *)0x0) goto LAB_0071eae2;
  if (*pcVar3 == -100) {
    __s2 = this->regmust;
    if (__s2 == (char *)0x0) {
LAB_0071eaf4:
      end = rmatch->endp;
      local_50.regbol = string;
      if (this->reganch != '\0') {
        iVar2 = RegExpFind::regtry(&local_50,string,rmatch->startp,end,pcVar3);
        goto LAB_0071eae2;
      }
      if (this->regstart == '\0') {
        do {
          iVar2 = RegExpFind::regtry(&local_50,string,rmatch->startp,end,this->program);
          if (iVar2 != 0) break;
          cVar1 = *string;
          string = string + 1;
        } while (cVar1 != '\0');
        goto LAB_0071eae2;
      }
      pcVar3 = strchr(string,(int)this->regstart);
      if (pcVar3 != (char *)0x0) {
        do {
          iVar2 = RegExpFind::regtry(&local_50,pcVar3,rmatch->startp,end,this->program);
          if (iVar2 != 0) break;
          pcVar3 = strchr(pcVar3 + 1,(int)this->regstart);
        } while (pcVar3 != (char *)0x0);
        goto LAB_0071eae2;
      }
    }
    else {
      cVar1 = *__s2;
      __s1 = strchr(string,(int)cVar1);
      if (__s1 != (char *)0x0) {
        __n = this->regmlen;
        do {
          iVar2 = strncmp(__s1,__s2,__n);
          if (iVar2 == 0) goto LAB_0071eaf4;
          __s1 = strchr(__s1 + 1,(int)cVar1);
        } while (__s1 != (char *)0x0);
      }
    }
  }
  else {
    puts("RegularExpression::find(): Compiled regular expression corrupted.");
  }
  iVar2 = 0;
LAB_0071eae2:
  return SUB41(iVar2,0);
}

Assistant:

bool RegularExpression::find(char const* string,
                             RegularExpressionMatch& rmatch) const
{
  const char* s;

  rmatch.clear();
  rmatch.searchstring = string;

  if (!this->program) {
    return false;
  }

  // Check validity of program.
  if (UCHARAT(this->program) != MAGIC) {
    // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf(
      "RegularExpression::find(): Compiled regular expression corrupted.\n");
    return false;
  }

  // If there is a "must appear" string, look for it.
  if (this->regmust) {
    s = string;
    while ((s = strchr(s, this->regmust[0]))) {
      if (strncmp(s, this->regmust, this->regmlen) == 0)
        break; // Found it.
      s++;
    }
    if (!s) // Not present.
      return false;
  }

  RegExpFind regFind;

  // Mark beginning of line for ^ .
  regFind.regbol = string;

  // Simplest case:  anchored match need be tried only once.
  if (this->reganch)
    return (
      regFind.regtry(string, rmatch.startp, rmatch.endp, this->program) != 0);

  // Messy cases:  unanchored match.
  s = string;
  if (this->regstart != '\0')
    // We know what char it must start with.
    while ((s = strchr(s, this->regstart))) {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
      s++;
    }
  else
    // We don't -- general case.
    do {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
    } while (*s++ != '\0');

  // Failure.
  return false;
}